

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::print(Instruction *this,ostream *os)

{
  ostream *poVar1;
  code *UNRECOVERED_JUMPTABLE;
  long lVar2;
  
  poVar1 = std::operator<<(os,*(char **)(names + (ulong)this->opcode * 8));
  std::operator<<(poVar1," ");
  lVar2 = (ulong)this->opcode * 0x10;
  UNRECOVERED_JUMPTABLE = *(code **)(engine + lVar2);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(UNRECOVERED_JUMPTABLE +
                   *(long *)(&this->opcode + *(long *)(engine + lVar2 + 8)) + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(&this->opcode + *(long *)(engine + lVar2 + 8),os);
  return;
}

Assistant:

void Instruction::print(std::ostream& os) const {
		os << names[opcode] << " ";
		auto handler = engine[opcode];
		(this->*handler)(os);
	}